

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Index __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>::
New<wabt::interp::Event*>
          (FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
           *this,Event **args)

{
  long lVar1;
  long *plVar2;
  iterator __position;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar1 = *(long *)(this + 0x20);
  if (*(long *)(this + 0x18) == lVar1) {
    if (*(long *)(this + 8) - *(long *)this >> 3 !=
        (ulong)*(uint *)(this + 0x48) + (*(long *)(this + 0x40) - *(long *)(this + 0x30)) * 8) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Event *>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)(this + 0x30),false);
    __position._M_current =
         *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
          (this + 8);
    if (__position._M_current ==
        *(unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> **)
         (this + 0x10)) {
      std::
      vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
      ::_M_realloc_insert<wabt::interp::Event*>
                ((vector<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>,std::allocator<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>>
                  *)this,__position,args);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>._M_t.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl = (Object *)*args;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
    uVar6 = (*(long *)(this + 8) - *(long *)this >> 3) - 1;
  }
  else {
    uVar6 = *(ulong *)(lVar1 + -8);
    uVar3 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar3 = uVar6;
    }
    lVar4 = ((long)uVar3 >> 6) * 8 + *(long *)(this + 0x30);
    uVar5 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
    uVar3 = *(ulong *)(lVar4 + -8 + uVar5 * 8);
    if ((uVar3 >> (uVar6 & 0x3f) & 1) == 0) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<std::unique_ptr<wabt::interp::Object>>::New(Args &&...) [T = std::unique_ptr<wabt::interp::Object>, Args = <wabt::interp::Event *>]"
                   );
    }
    *(long *)(this + 0x20) = lVar1 + -8;
    *(ulong *)(lVar4 + uVar5 * 8 + -8) = uVar3 & ~(1L << ((byte)uVar6 & 0x3f));
    plVar2 = *(long **)(*(long *)this + uVar6 * 8);
    *(Event **)(*(long *)this + uVar6 * 8) = *args;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  return uVar6;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}